

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<char_const(&)[25],void>
          (ValueImpl<true> *this,char (*value) [25])

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,*value,&local_39);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->consume_after)._M_dataplus._M_p = (pointer)&(this->consume_after).field_2;
  (this->consume_after)._M_string_length = 0;
  (this->consume_after).field_2._M_local_buf[0] = '\0';
  this->consume_parens_if_empty = false;
  if (*(__index_type *)
       ((long)&(this->value).
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
       + 0x20) == '\x01') {
    std::__cxx11::string::assign((char *)&this->consume_after);
  }
  return;
}

Assistant:

ValueImpl(Value&& value)  // NOLINT
      : value(ToStringOrCallback(std::forward<Value>(value), Rank2{})) {
    if (std::holds_alternative<Callback>(this->value)) {
      consume_after = ";,";
    }
  }